

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmerdb.cpp
# Opt level: O2

uint64_t find_kmer_db_vector(vector<unsigned_long,_std::allocator<unsigned_long>_> *kmers,
                            uint64_t kmer,uint32_t kmer_size)

{
  ulong *puVar1;
  ulong *puVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t local_40;
  ulong local_38;
  uint64_t local_30;
  uint64_t kmer_local;
  uint32_t kmer_size_local;
  
  local_30 = kmer;
  kmer_local._4_4_ = kmer_size;
  is_canonized_kmer_representation_flag(&local_40,(uint32 *)&local_30);
  puVar2 = (kmers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (kmers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = (long)puVar1 - (long)puVar2 >> 3;
  while (uVar4 = uVar5, 0 < (long)uVar4) {
    uVar5 = uVar4 >> 1;
    if ((puVar2[uVar5] & 0x3fffffffffffffff) < (local_38 & 0x3fffffffffffffff)) {
      puVar2 = puVar2 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar4;
    }
  }
  if (puVar2 == puVar1) {
    uVar3 = 0;
  }
  else {
    uVar3 = (uint64_t)((*puVar2 & 0x3fffffffffffffff) <= (local_38 & 0x3fffffffffffffff));
  }
  return uVar3;
}

Assistant:

uint64_t find_kmer_db_vector(vector<uint64_t> *kmers , uint64_t kmer, uint32_t kmer_size){
    uint64_t k, flag;
    tie(k, flag)  = is_canonized_kmer_representation_flag(kmer, kmer_size);
    
    uint64_t ret =(uint64_t ) binary_search(kmers->begin(), kmers->end(), k, 
        [](const uint64_t & a, const uint64_t & b) -> bool
		{return (a&0x3FFFFFFFFFFFFFFF) < (b&0x3FFFFFFFFFFFFFFF);});

    return ret;
}